

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlRefPtr xmlAddRef(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  long lVar3;
  xmlListPtr pxStack_48;
  int res;
  xmlListPtr ref_list;
  xmlRefTablePtr table;
  xmlRefPtr ret;
  xmlAttrPtr attr_local;
  xmlChar *value_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  table = (xmlRefTablePtr)0x0;
  if (doc == (xmlDocPtr)0x0) {
    return (xmlRefPtr)0x0;
  }
  if (value == (xmlChar *)0x0) {
    return (xmlRefPtr)0x0;
  }
  if (attr == (xmlAttrPtr)0x0) {
    return (xmlRefPtr)0x0;
  }
  ref_list = (xmlListPtr)doc->refs;
  if (ref_list == (xmlListPtr)0x0) {
    ref_list = (xmlListPtr)xmlHashCreateDict(0,doc->dict);
    doc->refs = ref_list;
    if ((xmlHashTablePtr)ref_list == (xmlHashTablePtr)0x0) goto LAB_0017b265;
  }
  table = (xmlRefTablePtr)(*xmlMalloc)(0x28);
  if ((xmlRefPtr)table != (xmlRefPtr)0x0) {
    memset(table,0,0x28);
    pxVar2 = xmlStrdup(value);
    ((xmlRefPtr)table)->value = pxVar2;
    if (((xmlRefPtr)table)->value != (xmlChar *)0x0) {
      iVar1 = xmlIsStreaming(ctxt);
      if (iVar1 == 0) {
        ((xmlRefPtr)table)->name = (xmlChar *)0x0;
        ((xmlRefPtr)table)->attr = attr;
      }
      else {
        pxVar2 = xmlStrdup(attr->name);
        ((xmlRefPtr)table)->name = pxVar2;
        if (((xmlRefPtr)table)->name == (xmlChar *)0x0) goto LAB_0017b265;
        ((xmlRefPtr)table)->attr = (xmlAttrPtr)0x0;
      }
      lVar3 = xmlGetLineNo(attr->parent);
      ((xmlRefPtr)table)->lineno = (int)lVar3;
      pxStack_48 = (xmlListPtr)xmlHashLookup((xmlHashTablePtr)ref_list,value);
      if (pxStack_48 == (xmlListPtr)0x0) {
        pxStack_48 = xmlListCreate(xmlFreeRef,xmlDummyCompare);
        if (pxStack_48 == (xmlListPtr)0x0) goto LAB_0017b265;
        iVar1 = xmlHashAdd((xmlHashTablePtr)ref_list,value,pxStack_48);
        if (iVar1 < 1) {
          xmlListDelete(pxStack_48);
          goto LAB_0017b265;
        }
      }
      iVar1 = xmlListAppend(pxStack_48,table);
      if (iVar1 == 0) {
        return (xmlRefPtr)table;
      }
    }
  }
LAB_0017b265:
  xmlVErrMemory(ctxt);
  if (table != (xmlRefTablePtr)0x0) {
    lVar3._0_4_ = table->size;
    lVar3._4_4_ = table->nbElems;
    if (lVar3 != 0) {
      (*xmlFree)(*(void **)&table->size);
    }
    if (*(long *)&table->randomSeed != 0) {
      (*xmlFree)(*(void **)&table->randomSeed);
    }
    (*xmlFree)(table);
  }
  return (xmlRefPtr)0x0;
}

Assistant:

xmlRefPtr
xmlAddRef(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
    xmlAttrPtr attr) {
    xmlRefPtr ret = NULL;
    xmlRefTablePtr table;
    xmlListPtr ref_list;

    if (doc == NULL) {
        return(NULL);
    }
    if (value == NULL) {
        return(NULL);
    }
    if (attr == NULL) {
        return(NULL);
    }

    /*
     * Create the Ref table if needed.
     */
    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL) {
        doc->refs = table = xmlHashCreateDict(0, doc->dict);
        if (table == NULL)
            goto failed;
    }

    ret = (xmlRefPtr) xmlMalloc(sizeof(xmlRef));
    if (ret == NULL)
        goto failed;
    memset(ret, 0, sizeof(*ret));

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    if (ret->value == NULL)
        goto failed;
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	ret->name = xmlStrdup(attr->name);
        if (ret->name == NULL)
            goto failed;
	ret->attr = NULL;
    } else {
	ret->name = NULL;
	ret->attr = attr;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    /* To add a reference :-
     * References are maintained as a list of references,
     * Lookup the entry, if no entry create new nodelist
     * Add the owning node to the NodeList
     * Return the ref
     */

    ref_list = xmlHashLookup(table, value);
    if (ref_list == NULL) {
        int res;

        ref_list = xmlListCreate(xmlFreeRef, xmlDummyCompare);
        if (ref_list == NULL)
	    goto failed;
        res = xmlHashAdd(table, value, ref_list);
        if (res <= 0) {
            xmlListDelete(ref_list);
	    goto failed;
        }
    }
    if (xmlListAppend(ref_list, ret) != 0)
        goto failed;
    return(ret);

failed:
    xmlVErrMemory(ctxt);
    if (ret != NULL) {
        if (ret->value != NULL)
	    xmlFree((char *)ret->value);
        if (ret->name != NULL)
	    xmlFree((char *)ret->name);
        xmlFree(ret);
    }
    return(NULL);
}